

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tarray.h
# Opt level: O1

uint __thiscall TArray<FString,_FString>::Find(TArray<FString,_FString> *this,FString *item)

{
  FString *pFVar1;
  char *__s2;
  int iVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  
  uVar5 = (ulong)this->Count;
  if (uVar5 == 0) {
    uVar4 = 0;
  }
  else {
    pFVar1 = this->Array;
    __s2 = item->Chars;
    uVar3 = 0;
    do {
      iVar2 = strcmp(pFVar1[uVar3].Chars,__s2);
      uVar4 = uVar3;
      if (iVar2 == 0) break;
      uVar3 = uVar3 + 1;
      uVar4 = uVar5;
    } while (uVar5 != uVar3);
  }
  return (uint)uVar4;
}

Assistant:

unsigned int Find(const T& item) const
    {
        unsigned int i;
        for(i = 0;i < Count;++i)
        {
            if(Array[i] == item)
                break;
        }
        return i;
    }